

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

void scheduler_fiber_proc_for_user_worker(cilk_fiber *fiber)

{
  __cilkrts_worker *w_00;
  cilk_fiber *in_RDI;
  __cilkrts_worker *unaff_retaddr;
  __cilkrts_worker *w;
  
  w_00 = cilk_fiber_get_owner(in_RDI);
  if (w_00 == (__cilkrts_worker *)0x0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                  ,0x756,"w");
  }
  if (w_00->l->type == WORKER_USER) {
    verify_current_wkr(w_00);
    __cilkrts_run_scheduler_with_exceptions(unaff_retaddr);
    return;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                ,0x759,"WORKER_USER == w->l->type");
}

Assistant:

COMMON_PORTABLE
void scheduler_fiber_proc_for_user_worker(cilk_fiber *fiber)
{
    __cilkrts_worker* w = cilk_fiber_get_owner(fiber);
    CILK_ASSERT(w);

    // This must be a user worker
    CILK_ASSERT(WORKER_USER == w->l->type);

    // If we aren't the current worker, then something is very wrong
    // here..
    verify_current_wkr(w);

    __cilkrts_run_scheduler_with_exceptions(w);
}